

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Clara::CommandLine<Catch::ConfigData>::Arg::Arg
          (Arg *this,BoundArgFunction<Catch::ConfigData> *_boundField)

{
  BoundArgFunction<Catch::ConfigData> *in_RSI;
  BoundArgFunction<Catch::ConfigData> *in_RDI;
  
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction(in_RSI,in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1920ae);
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0xc));
  *(undefined4 *)&in_RDI[0x10].functionObj = 0xffffffff;
  return;
}

Assistant:

Arg( Detail::BoundArgFunction<ConfigT> const& _boundField ) : boundField( _boundField ), position( -1 ) {}